

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grob_array.h
# Opt level: O2

void __thiscall lume::GrobArray::push_back(GrobArray *this,initializer_list<unsigned_int> inds)

{
  index_t iVar1;
  BadNumberOfIndices *this_00;
  char *pcVar2;
  string *psVar3;
  string *what;
  unsigned_long __val;
  long lVar4;
  allocator local_91;
  uint i;
  string local_70;
  string local_50;
  
  __val = inds._M_len;
  iVar1 = GrobDesc::num_corners(&this->m_grobDesc);
  if (iVar1 == __val) {
    for (lVar4 = 0; __val << 2 != lVar4; lVar4 = lVar4 + 4) {
      i = *(uint *)((long)inds._M_array + lVar4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&(this->m_array).m_vector,&i);
    }
    return;
  }
  this_00 = (BadNumberOfIndices *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string((string *)&i,"expected: ",&local_91);
  iVar1 = GrobDesc::num_corners(&this->m_grobDesc);
  std::__cxx11::to_string(&local_50,iVar1);
  pcVar2 = (char *)std::__cxx11::string::append((string *)&i);
  psVar3 = (string *)std::__cxx11::string::append(pcVar2);
  std::__cxx11::to_string(&local_70,__val);
  what = (string *)std::__cxx11::string::append(psVar3);
  BadNumberOfIndices::BadNumberOfIndices(this_00,what);
  __cxa_throw(this_00,&BadNumberOfIndices::typeinfo,BadNumberOfIndices::~BadNumberOfIndices);
}

Assistant:

inline void push_back (std::initializer_list <index_t> inds)
	{
		using std::string;
		using std::to_string;

		if (inds.size() != num_grob_corners())
			throw BadNumberOfIndices (string ("expected: ").
			                          append (to_string (num_grob_corners())).
			                          append (", given: ").
			                          append (to_string (inds.size())));

		for(auto i : inds) 
			m_array.push_back (i);
	}